

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReReloop.cpp
# Opt level: O0

void __thiscall wasm::ReReloop::IfTask::run(IfTask *this)

{
  Block *pBVar1;
  Block *to;
  Block *after_1;
  Block *ifFalseEnd;
  Block *after;
  IfTask *this_local;
  
  if (this->phase == 0) {
    pBVar1 = getCurrCFGBlock((this->super_Task).parent);
    this->ifTrueEnd = pBVar1;
    pBVar1 = startCFGBlock((this->super_Task).parent);
    addBranch((this->super_Task).parent,this->condition,pBVar1,(Expression *)0x0);
    if (this->curr->ifFalse == (Expression *)0x0) {
      addBranch((this->super_Task).parent,this->ifTrueEnd,pBVar1,(Expression *)0x0);
    }
    this->phase = this->phase + 1;
  }
  else {
    if (this->phase != 1) {
      handle_unreachable("invalid phase",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/ReReloop.cpp"
                         ,200);
    }
    pBVar1 = getCurrCFGBlock((this->super_Task).parent);
    to = startCFGBlock((this->super_Task).parent);
    addBranch((this->super_Task).parent,this->ifTrueEnd,to,(Expression *)0x0);
    addBranch((this->super_Task).parent,pBVar1,to,(Expression *)0x0);
  }
  return;
}

Assistant:

void run() override {
      if (phase == 0) {
        // end of ifTrue
        ifTrueEnd = parent.getCurrCFGBlock();
        auto* after = parent.startCFGBlock();
        // if condition was false, go after the ifTrue, to ifFalse or outside
        parent.addBranch(condition, after);
        if (!curr->ifFalse) {
          parent.addBranch(ifTrueEnd, after);
        }
        phase++;
      } else if (phase == 1) {
        // end if ifFalse
        auto* ifFalseEnd = parent.getCurrCFGBlock();
        auto* after = parent.startCFGBlock();
        parent.addBranch(ifTrueEnd, after);
        parent.addBranch(ifFalseEnd, after);
      } else {
        WASM_UNREACHABLE("invalid phase");
      }
    }